

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_pages.cc
# Opt level: O1

int __thiscall QPDF::findPage(QPDF *this,QPDFObjGen og)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  iterator iVar3;
  QPDFExc *this_00;
  string *filename;
  string local_50;
  QPDFObjGen local_30;
  
  local_30 = og;
  flattenPagesTree(this);
  iVar3 = std::
          _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_int>,_std::_Select1st<std::pair<const_QPDFObjGen,_int>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
          ::find(&(((this->m)._M_t.
                    super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                    super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                    super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                  pageobj_to_pages_pos)._M_t,&local_30);
  if (iVar3._M_node !=
      (_Base_ptr)
      ((long)&((this->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->pageobj_to_pages_pos +
      8U)) {
    return *(int *)&iVar3._M_node[1]._M_parent;
  }
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"page object","");
  setLastObjectDescription(this,&local_50,local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  this_00 = (QPDFExc *)__cxa_allocate_exception(0x80);
  filename = (string *)
             (**(code **)(**(long **)&(((this->m)._M_t.
                                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)
                                      ->file).
                                      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                         0x18))();
  _Var2._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"page object not referenced in /Pages tree","");
  QPDFExc::QPDFExc(this_00,qpdf_e_pages,filename,&(_Var2._M_head_impl)->last_object_description,0,
                   &local_50);
  __cxa_throw(this_00,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

int
QPDF::findPage(QPDFObjGen og)
{
    flattenPagesTree();
    auto it = m->pageobj_to_pages_pos.find(og);
    if (it == m->pageobj_to_pages_pos.end()) {
        QTC::TC("qpdf", "QPDF_pages findPage not found");
        setLastObjectDescription("page object", og);
        throw QPDFExc(
            qpdf_e_pages,
            m->file->getName(),
            m->last_object_description,
            0,
            "page object not referenced in /Pages tree");
    }
    return (*it).second;
}